

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Boids.cpp
# Opt level: O0

void __thiscall anon_unknown.dwarf_2542f::BoidsPlugIn::nextPD(BoidsPlugIn *this)

{
  bool bVar1;
  void *pvVar2;
  int iVar3;
  long in_RDI;
  Vec3 *in_stack_00000008;
  Vec3 *in_stack_00000010;
  Vec3 *in_stack_00000018;
  LQProximityDatabase<OpenSteer::AbstractVehicle_*> *in_stack_00000020;
  iterator i;
  Vec3 dimensions;
  float diameter;
  Vec3 divisions;
  float div;
  Vec3 center;
  int totalPD;
  ProximityDatabase *oldPD;
  vector<(anonymous_namespace)::Boid_*,_std::allocator<(anonymous_namespace)::Boid_*>_>
  *in_stack_ffffffffffffff48;
  BruteForceProximityDatabase<OpenSteer::AbstractVehicle_*> *in_stack_ffffffffffffff50;
  __normal_iterator<(anonymous_namespace)::Boid_*const_*,_std::vector<(anonymous_namespace)::Boid_*,_std::allocator<(anonymous_namespace)::Boid_*>_>_>
  *in_stack_ffffffffffffff58;
  Boid *in_stack_ffffffffffffff60;
  __normal_iterator<(anonymous_namespace)::Boid_*const_*,_std::vector<(anonymous_namespace)::Boid_*,_std::allocator<(anonymous_namespace)::Boid_*>_>_>
  local_58 [3];
  Vec3 local_40;
  float local_34;
  Vec3 local_30;
  undefined4 local_24;
  undefined1 local_20 [32];
  
  local_20._16_8_ = *(undefined8 *)(in_RDI + 0x20);
  local_20._12_4_ = 2.8026e-45;
  iVar3 = *(int *)(in_RDI + 0x2c) + 1;
  iVar3 = iVar3 - ((*(int *)(in_RDI + 0x2c) + 1) - (iVar3 >> 0x1f) & 0xfffffffeU);
  *(int *)(in_RDI + 0x2c) = iVar3;
  if (iVar3 == 0) {
    in_stack_ffffffffffffff60 = (Boid *)local_20;
    OpenSteer::Vec3::Vec3((Vec3 *)in_stack_ffffffffffffff60);
    local_24 = 0x41200000;
    OpenSteer::Vec3::Vec3(&local_30,10.0,10.0,10.0);
    local_34 = (anonymous_namespace)::Boid::worldRadius * 1.1 +
               (anonymous_namespace)::Boid::worldRadius * 1.1;
    OpenSteer::Vec3::Vec3(&local_40,local_34,local_34,local_34);
    pvVar2 = operator_new(0x10);
    OpenSteer::LQProximityDatabase<OpenSteer::AbstractVehicle_*>::LQProximityDatabase
              (in_stack_00000020,in_stack_00000018,in_stack_00000010,in_stack_00000008);
    *(void **)(in_RDI + 0x20) = pvVar2;
  }
  else if (iVar3 == 1) {
    in_stack_ffffffffffffff58 =
         (__normal_iterator<(anonymous_namespace)::Boid_*const_*,_std::vector<(anonymous_namespace)::Boid_*,_std::allocator<(anonymous_namespace)::Boid_*>_>_>
          *)operator_new(0x20);
    OpenSteer::BruteForceProximityDatabase<OpenSteer::AbstractVehicle_*>::
    BruteForceProximityDatabase(in_stack_ffffffffffffff50);
    *(__normal_iterator<(anonymous_namespace)::Boid_*const_*,_std::vector<(anonymous_namespace)::Boid_*,_std::allocator<(anonymous_namespace)::Boid_*>_>_>
      **)(in_RDI + 0x20) = in_stack_ffffffffffffff58;
  }
  std::vector<(anonymous_namespace)::Boid_*,_std::allocator<(anonymous_namespace)::Boid_*>_>::begin
            (in_stack_ffffffffffffff48);
  __gnu_cxx::
  __normal_iterator<(anonymous_namespace)::Boid*const*,std::vector<(anonymous_namespace)::Boid*,std::allocator<(anonymous_namespace)::Boid*>>>
  ::__normal_iterator<(anonymous_namespace)::Boid**>
            ((__normal_iterator<(anonymous_namespace)::Boid_*const_*,_std::vector<(anonymous_namespace)::Boid_*,_std::allocator<(anonymous_namespace)::Boid_*>_>_>
              *)in_stack_ffffffffffffff50,
             (__normal_iterator<(anonymous_namespace)::Boid_**,_std::vector<(anonymous_namespace)::Boid_*,_std::allocator<(anonymous_namespace)::Boid_*>_>_>
              *)in_stack_ffffffffffffff48);
  while( true ) {
    std::vector<(anonymous_namespace)::Boid_*,_std::allocator<(anonymous_namespace)::Boid_*>_>::end
              (in_stack_ffffffffffffff48);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<(anonymous_namespace)::Boid_*const_*,_std::vector<(anonymous_namespace)::Boid_*,_std::allocator<(anonymous_namespace)::Boid_*>_>_>
                        *)in_stack_ffffffffffffff50,
                       (__normal_iterator<(anonymous_namespace)::Boid_**,_std::vector<(anonymous_namespace)::Boid_*,_std::allocator<(anonymous_namespace)::Boid_*>_>_>
                        *)in_stack_ffffffffffffff48);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<(anonymous_namespace)::Boid_*const_*,_std::vector<(anonymous_namespace)::Boid_*,_std::allocator<(anonymous_namespace)::Boid_*>_>_>
    ::operator*(local_58);
    Boid::newPD(in_stack_ffffffffffffff60,(ProximityDatabase *)in_stack_ffffffffffffff58);
    __gnu_cxx::
    __normal_iterator<(anonymous_namespace)::Boid_*const_*,_std::vector<(anonymous_namespace)::Boid_*,_std::allocator<(anonymous_namespace)::Boid_*>_>_>
    ::operator++(in_stack_ffffffffffffff58,(int)((ulong)in_stack_ffffffffffffff50 >> 0x20));
  }
  if ((long *)local_20._16_8_ != (long *)0x0) {
    (**(code **)(*(long *)local_20._16_8_ + 8))();
  }
  return;
}

Assistant:

void nextPD (void)
        {
            // save pointer to old PD
            ProximityDatabase* oldPD = pd;

            // allocate new PD
            const int totalPD = 2;
            switch (cyclePD = (cyclePD + 1) % totalPD)
            {
            case 0:
                {
                    const Vec3 center;
                    const float div = 10.0f;
                    const Vec3 divisions (div, div, div);
                    const float diameter = Boid::worldRadius * 1.1f * 2;
                    const Vec3 dimensions (diameter, diameter, diameter);
                    typedef LQProximityDatabase<AbstractVehicle*> LQPDAV;
                    pd = new LQPDAV (center, dimensions, divisions);
                    break;
                }
            case 1:
                {
                    pd = new BruteForceProximityDatabase<AbstractVehicle*> ();
                    break;
                }
            }

            // switch each boid to new PD
            for (iterator i=flock.begin(); i!=flock.end(); i++) (**i).newPD(*pd);

            // delete old PD (if any)
            delete oldPD;
        }